

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O2

bool bc7decomp::unpack_bc7_mode4_5(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  color_rgba *pcVar8;
  uint32_t e;
  uint32_t uVar9;
  long lVar10;
  uint32_t i;
  long lVar11;
  uint uVar12;
  uint32_t i_2;
  uint32_t i_3;
  uint32_t uVar13;
  uint32_t c_1;
  uint32_t uVar14;
  uint32_t i_1;
  uint32_t *puVar15;
  bool bVar16;
  uint32_t bit_offset;
  uint32_t local_118;
  uint32_t local_114;
  uint32_t *local_110;
  color_rgba endpoints [2];
  uint32_t weight_bits [2];
  color_rgba block_colors [8];
  uint32_t a_weights [16];
  uint32_t weights [16];
  
  bVar16 = mode != 4;
  bit_offset = 0;
  uVar2 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,mode + 1);
  uVar7 = 1 << ((byte)mode & 0x1f);
  if (uVar2 == uVar7) {
    uVar3 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,2);
    local_118 = 0;
    if (mode == 4) {
      local_118 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,1);
    }
    local_114 = mode == 4 | 2;
    uVar14 = (uint)bVar16 * 2 + 5;
    uVar9 = (uint)bVar16 * 2 + 6;
    pcVar8 = endpoints;
    for (local_110 = (uint32_t *)0x0; local_110 != (uint32_t *)0x4;
        local_110 = (uint32_t *)((long)local_110 + 1)) {
      uVar13 = uVar14;
      if (local_110 == (uint32_t *)0x3) {
        uVar13 = uVar9;
      }
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        uVar4 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,uVar13);
        pcVar8[lVar10].field_0.m_comps[0] = (uint8_t)uVar4;
      }
      pcVar8 = (color_rgba *)((long)&pcVar8->field_0 + 1);
    }
    bVar16 = local_118 == 0;
    uVar13 = local_114;
    if (bVar16) {
      uVar13 = 2;
    }
    weight_bits[0] = uVar13;
    uVar4 = 2;
    if (bVar16) {
      uVar4 = local_114;
    }
    weight_bits[1] = uVar4;
    local_114 = weight_bits[local_118];
    local_110 = weights;
    puVar15 = a_weights;
    if (bVar16) {
      puVar15 = local_110;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      uVar5 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,local_114 - (lVar10 == 0));
      puVar15[lVar10] = uVar5;
    }
    uVar5 = weight_bits[1 - local_118];
    if (local_118 == 0) {
      local_110 = a_weights;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      uVar6 = read_bits32((uint8_t *)pBlock_bits,&bit_offset,uVar5 - (lVar10 == 0));
      local_110[lVar10] = uVar6;
    }
    pcVar8 = endpoints;
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        uVar5 = uVar14;
        if (lVar11 == 3) {
          uVar5 = uVar9;
        }
        uVar12 = (uint)(pcVar8->field_0).m_comps[lVar11] << (8U - (sbyte)uVar5 & 0x1f);
        (pcVar8->field_0).m_comps[lVar11] = (byte)(uVar12 >> (sbyte)uVar5) | (byte)uVar12;
      }
      pcVar8 = pcVar8 + 1;
    }
    for (uVar12 = 0; uVar12 >> ((byte)uVar13 & 0x1f) == 0; uVar12 = uVar12 + 1) {
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        uVar9 = bc7_interp((uint)endpoints[0].field_0.m_comps[lVar10],
                           (uint)endpoints[1].field_0.m_comps[lVar10],uVar12,uVar13);
        block_colors[uVar12].field_0.m_comps[lVar10] = (uint8_t)uVar9;
      }
    }
    for (uVar12 = 0; uVar12 >> ((byte)uVar4 & 0x1f) == 0; uVar12 = uVar12 + 1) {
      uVar9 = bc7_interp((uint)(byte)endpoints[0].field_0._3_1_,
                         (uint)(byte)endpoints[1].field_0._3_1_,uVar12,uVar4);
      block_colors[uVar12].field_0.m_comps[3] = (uint8_t)uVar9;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      pPixels[lVar10].field_0 = block_colors[weights[lVar10]].field_0;
      uVar1 = block_colors[a_weights[lVar10]].field_0.m_comps[3];
      pPixels[lVar10].field_0.m_comps[3] = uVar1;
      if (uVar3 != 0) {
        pPixels[lVar10].field_0.m_comps[3] = pPixels[lVar10].field_0.m_comps[uVar3 - 1];
        pPixels[lVar10].field_0.m_comps[uVar3 - 1] = uVar1;
      }
    }
  }
  return uVar2 == uVar7;
}

Assistant:

bool unpack_bc7_mode4_5(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	const uint32_t ENDPOINTS = 2;
	const uint32_t COMPS = 4;
	const uint32_t WEIGHT_BITS = 2;
	const uint32_t A_WEIGHT_BITS = (mode == 4) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 4) ? 5 : 7;
	const uint32_t A_ENDPOINT_BITS = (mode == 4) ? 6 : 8;
	//const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
	//const uint32_t A_WEIGHT_VALS = 1 << A_WEIGHT_BITS;

	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t comp_rot = read_bits32(pBuf, bit_offset, 2);
	const uint32_t index_mode = (mode == 4) ? read_bits32(pBuf, bit_offset, 1) : 0;

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, (c == 3) ? A_ENDPOINT_BITS : ENDPOINT_BITS);
		
	const uint32_t weight_bits[2] = { index_mode ? A_WEIGHT_BITS : WEIGHT_BITS,  index_mode ? WEIGHT_BITS : A_WEIGHT_BITS };
		
	uint32_t weights[16], a_weights[16];
		
	for (uint32_t i = 0; i < 16; i++)
		(index_mode ? a_weights : weights)[i] = read_bits32(pBuf, bit_offset, weight_bits[index_mode] - ((!i) ? 1 : 0));

	for (uint32_t i = 0; i < 16; i++)
		(index_mode ? weights : a_weights)[i] = read_bits32(pBuf, bit_offset, weight_bits[1 - index_mode] - ((!i) ? 1 : 0));

	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)bc7_dequant(endpoints[e][c], (c == 3) ? A_ENDPOINT_BITS : ENDPOINT_BITS);

	color_rgba block_colors[8];
	for (uint32_t i = 0; i < (1U << weight_bits[0]); i++)
		for (uint32_t c = 0; c < 3; c++)
			block_colors[i][c] = (uint8_t)bc7_interp(endpoints[0][c], endpoints[1][c], i, weight_bits[0]);

	for (uint32_t i = 0; i < (1U << weight_bits[1]); i++)
		block_colors[i][3] = (uint8_t)bc7_interp(endpoints[0][3], endpoints[1][3], i, weight_bits[1]);

	for (uint32_t i = 0; i < 16; i++)
	{
		pPixels[i] = block_colors[weights[i]];
		pPixels[i].a = block_colors[a_weights[i]].a;
		if (comp_rot >= 1)
			std::swap(pPixels[i].a, pPixels[i].m_comps[comp_rot - 1]);
	}

	return true;
}